

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

void __thiscall
efsw::FileWatcherInotify::FileWatcherInotify(FileWatcherInotify *this,FileWatcher *parent)

{
  int iVar1;
  FileWatcher *parent_local;
  FileWatcherInotify *this_local;
  
  FileWatcherImpl::FileWatcherImpl(&this->super_FileWatcherImpl,parent);
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherInotify_00184c28;
  std::
  map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::map(&this->mWatches);
  std::
  map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::map(&this->mRealWatches);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::unordered_map(&this->mWatchesRef);
  this->mFD = -1;
  this->mThread = (Thread *)0x0;
  Mutex::Mutex(&this->mWatchesLock);
  Mutex::Mutex(&this->mRealWatchesLock);
  Mutex::Mutex(&this->mInitLock);
  this->mIsTakingAction = false;
  std::
  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->mMovedOutsideWatches);
  iVar1 = inotify_init();
  this->mFD = iVar1;
  if (-1 < this->mFD) {
    Atomic<bool>::operator=(&(this->super_FileWatcherImpl).mInitOK,true);
  }
  return;
}

Assistant:

FileWatcherInotify::FileWatcherInotify( FileWatcher* parent ) :
	FileWatcherImpl( parent ), mFD( -1 ), mThread( NULL ), mIsTakingAction( false ) {
	mFD = inotify_init();

	if ( mFD < 0 ) {
		efDEBUG( "Error: %s\n", strerror( errno ) );
	} else {
		mInitOK = true;
	}
}